

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Function * __thiscall wasm::TranslateToFuzzReader::addFunction(TranslateToFuzzReader *this)

{
  Module *pMVar1;
  pointer puVar2;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> _Var3;
  char *pcVar4;
  char cVar5;
  uint32_t uVar6;
  Type TVar7;
  Expression *pEVar8;
  Type *pTVar9;
  difference_type dVar10;
  undefined8 *puVar11;
  RefFunc *pRVar12;
  uintptr_t extraout_RDX;
  pointer ppEVar13;
  size_t extraout_RDX_00;
  size_t sVar14;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  size_t extraout_RDX_04;
  size_t extraout_RDX_05;
  size_t extraout_RDX_06;
  size_t extraout_RDX_07;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment;
  pointer puVar15;
  pointer ppEVar16;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *other;
  long lVar17;
  bool bVar18;
  Signature SVar19;
  Iterator __it;
  Iterator __it_00;
  Iterator __it_01;
  Iterator __it_02;
  Iterator __it_03;
  Iterator __it_04;
  Iterator __it_05;
  Name NVar20;
  undefined1 local_138 [8];
  FunctionCreationContext context;
  undefined1 auStack_a8 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  Type type_2;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> local_80;
  Type local_70;
  Type paramType;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> local_60;
  __single_object allocation;
  undefined1 auStack_48 [8];
  vector<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_> compatibleSegments;
  
  allocation._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       &this->random;
  uVar6 = Random::upToSquared((Random *)
                              allocation._M_t.
                              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,100);
  this->LOGGING_PERCENT = uVar6;
  std::make_unique<wasm::Function>();
  pMVar1 = this->wasm;
  Name::Name((Name *)&context.typeLocals._M_h._M_single_bucket,"func");
  NVar20 = Names::getValidFunctionName(pMVar1,(Name)stack0xffffffffffffff48);
  *(IString *)
   local_60._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl = NVar20.super_IString.str;
  uVar6 = Random::upToSquared((Random *)
                              allocation._M_t.
                              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                              (this->fuzzParams->super_FuzzParams).MAX_PARAMS);
  auStack_a8 = (undefined1  [8])0x0;
  params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_a8,(ulong)uVar6);
  while (bVar18 = uVar6 != 0, uVar6 = uVar6 - 1, bVar18) {
    local_138 = (undefined1  [8])getSingleConcreteType(this);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_a8,(value_type *)local_138
              );
  }
  wasm::Type::Type(&local_70,auStack_a8);
  TVar7 = getControlFlowType(this);
  SVar19.results.id = TVar7.id;
  SVar19.params.id = local_70.id;
  wasm::HeapType::HeapType((HeapType *)local_138,SVar19);
  ((HeapType *)
  ((long)local_60._M_t.
         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x38))->id =
       (uintptr_t)local_138;
  uVar6 = Random::upToSquared((Random *)
                              allocation._M_t.
                              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                              (this->fuzzParams->super_FuzzParams).MAX_VARS);
  paramType.id = (long)local_60._M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x38;
  while (bVar18 = uVar6 != 0, uVar6 = uVar6 - 1, bVar18) {
    local_138 = (undefined1  [8])getConcreteType(this);
    cVar5 = wasm::TypeUpdating::canHandleAsLocal((Type)local_138);
    if (cVar5 == '\0') {
      local_138 = (undefined1  [8])0x2;
    }
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
               ((long)local_60._M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x48),
               (value_type *)local_138);
  }
  FunctionCreationContext::FunctionCreationContext
            ((FunctionCreationContext *)local_138,this,
             (Function *)
             local_60._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
  wasm::HeapType::getSignature();
  bVar18 = Random::oneIn((Random *)
                         allocation._M_t.
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,10);
  TVar7.id = extraout_RDX;
  if (bVar18) {
    TVar7.id = 1;
  }
  bVar18 = Random::oneIn((Random *)
                         allocation._M_t.
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,2);
  if (bVar18) {
    pEVar8 = makeBlock(this,TVar7);
  }
  else {
    pEVar8 = make(this,TVar7);
  }
  *(Expression **)
   ((long)local_60._M_t.
          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x60) = pEVar8;
  wasm::Module::addFunction((unique_ptr *)this->wasm);
  local_80 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)Type::end(&local_70);
  ppEVar13 = (pointer)local_80.index;
  pTVar9 = local_80.parent;
  compatibleSegments.
  super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  auStack_48 = (undefined1  [8])&local_70;
  dVar10 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator-
                     (&local_80,(Iterator *)auStack_48);
  sVar14 = extraout_RDX_00;
  for (lVar17 = dVar10 >> 2; 0 < lVar17; lVar17 = lVar17 + -1) {
    __it.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = sVar14;
    __it.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)compatibleSegments.
                 super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    bVar18 = __gnu_cxx::__ops::_Iter_negate<wasm::TranslateToFuzzReader::addFunction()::$_0>::
             operator()((_Iter_negate<wasm::TranslateToFuzzReader::addFunction()::__0> *)auStack_48,
                        __it);
    ppEVar16 = compatibleSegments.
               super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    other = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)auStack_48;
    if (bVar18) goto LAB_00150b27;
    __it_00.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)((long)compatibleSegments.
                        super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1);
    __it_00.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         extraout_RDX_01;
    compatibleSegments.
    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)__it_00.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
    ;
    bVar18 = __gnu_cxx::__ops::_Iter_negate<wasm::TranslateToFuzzReader::addFunction()::$_0>::
             operator()((_Iter_negate<wasm::TranslateToFuzzReader::addFunction()::__0> *)auStack_48,
                        __it_00);
    ppEVar16 = compatibleSegments.
               super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (bVar18) goto LAB_00150b27;
    __it_01.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)((long)compatibleSegments.
                        super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1);
    __it_01.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         extraout_RDX_02;
    compatibleSegments.
    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)__it_01.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
    ;
    bVar18 = __gnu_cxx::__ops::_Iter_negate<wasm::TranslateToFuzzReader::addFunction()::$_0>::
             operator()((_Iter_negate<wasm::TranslateToFuzzReader::addFunction()::__0> *)auStack_48,
                        __it_01);
    ppEVar16 = compatibleSegments.
               super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (bVar18) goto LAB_00150b27;
    __it_02.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)((long)compatibleSegments.
                        super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1);
    __it_02.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         extraout_RDX_03;
    compatibleSegments.
    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)__it_02.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
    ;
    bVar18 = __gnu_cxx::__ops::_Iter_negate<wasm::TranslateToFuzzReader::addFunction()::$_0>::
             operator()((_Iter_negate<wasm::TranslateToFuzzReader::addFunction()::__0> *)auStack_48,
                        __it_02);
    ppEVar16 = compatibleSegments.
               super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (bVar18) goto LAB_00150b27;
    compatibleSegments.
    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)compatibleSegments.
                         super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
    sVar14 = extraout_RDX_04;
  }
  other = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)auStack_48;
  dVar10 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator-
                     (&local_80,(Iterator *)other);
  if (dVar10 == 3) {
    __it_03.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         extraout_RDX_05;
    __it_03.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)compatibleSegments.
                 super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    bVar18 = __gnu_cxx::__ops::_Iter_negate<wasm::TranslateToFuzzReader::addFunction()::$_0>::
             operator()((_Iter_negate<wasm::TranslateToFuzzReader::addFunction()::__0> *)auStack_48,
                        __it_03);
    ppEVar16 = compatibleSegments.
               super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (bVar18) goto LAB_00150b27;
    compatibleSegments.
    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)compatibleSegments.
                         super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
    sVar14 = extraout_RDX_06;
LAB_00150af5:
    __it_04.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = sVar14;
    __it_04.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)compatibleSegments.
                 super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    bVar18 = __gnu_cxx::__ops::_Iter_negate<wasm::TranslateToFuzzReader::addFunction()::$_0>::
             operator()((_Iter_negate<wasm::TranslateToFuzzReader::addFunction()::__0> *)auStack_48,
                        __it_04);
    ppEVar16 = compatibleSegments.
               super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (bVar18) goto LAB_00150b27;
    compatibleSegments.
    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)compatibleSegments.
                         super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
    sVar14 = extraout_RDX_07;
LAB_00150b0d:
    __it_05.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = sVar14;
    __it_05.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)compatibleSegments.
                 super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    bVar18 = __gnu_cxx::__ops::_Iter_negate<wasm::TranslateToFuzzReader::addFunction()::$_0>::
             operator()((_Iter_negate<wasm::TranslateToFuzzReader::addFunction()::__0> *)auStack_48,
                        __it_05);
    ppEVar16 = compatibleSegments.
               super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (bVar18) goto LAB_00150b27;
  }
  else {
    sVar14 = extraout_RDX_05;
    if (dVar10 == 2) goto LAB_00150af5;
    if (dVar10 == 1) goto LAB_00150b0d;
  }
  ppEVar16 = (pointer)local_80.index;
  other = &local_80;
LAB_00150b27:
  if ((((ppEVar16 == ppEVar13) &&
       (((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)&other->parent)->parent ==
        pTVar9)) &&
      ((this->numAddedFunctions == 0 ||
       (bVar18 = Random::oneIn((Random *)
                               allocation._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,2),
       bVar18)))) &&
     ((NVar20.super_IString.str._M_str =
            *(char **)local_60._M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
      NVar20.super_IString.str._M_len = (size_t)this->wasm,
      lVar17 = wasm::Module::getExportOrNull(NVar20), lVar17 == 0 &&
      (this->preserveImportsAndExports == false)))) {
    pMVar1 = this->wasm;
    puVar11 = (undefined8 *)operator_new(0x30);
    pcVar4 = *(char **)((long)local_60._M_t.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8);
    auStack_48 = *(undefined1 (*) [8])
                  local_60._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    compatibleSegments.
    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         *(pointer *)
          ((long)local_60._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8);
    *puVar11 = *(undefined8 *)
                local_60._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    puVar11[1] = pcVar4;
    *(undefined4 *)(puVar11 + 2) = 0;
    puVar11[3] = auStack_48;
    puVar11[4] = compatibleSegments.
                 super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    *(undefined1 *)(puVar11 + 5) = 0;
    wasm::Module::addExport((Export *)pMVar1);
  }
  while ((bVar18 = Random::oneIn((Random *)
                                 allocation._M_t.
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,3),
         bVar18 && ((this->random).finishedInput == false))) {
    Type::Type((Type *)&params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(HeapType)*paramType.id,
               NonNullable,Inexact);
    compatibleSegments.
    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_48 = (undefined1  [8])0x0;
    compatibleSegments.
    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    puVar2 = (this->wasm->elementSegments).
             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar15 = (this->wasm->elementSegments).
                   super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar2;
        puVar15 = puVar15 + 1) {
      _Var3._M_head_impl =
           (puVar15->_M_t).
           super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
           _M_t.
           super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
           .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      if (*(char **)((long)&(_Var3._M_head_impl)->table + 8) != (char *)0x0) {
        local_80.parent = (Type *)_Var3._M_head_impl;
        cVar5 = wasm::Type::isSubType
                          ((Type)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (Type)((_Var3._M_head_impl)->type).id);
        if (cVar5 != '\0') {
          std::vector<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>::push_back
                    ((vector<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_> *)
                     auStack_48,(value_type *)&local_80);
        }
      }
    }
    uVar6 = Random::upTo((Random *)
                         allocation._M_t.
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                         (uint32_t)
                         ((ulong)((long)compatibleSegments.
                                        super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48
                                 ) >> 3));
    lVar17 = *(long *)((long)auStack_48 + (ulong)uVar6 * 8);
    pRVar12 = Builder::makeRefFunc
                        (&this->builder,
                         (IString)*(IString *)
                                   local_60._M_t.
                                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                   .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                         (HeapType)
                         ((HeapType *)
                         ((long)local_60._M_t.
                                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x38)
                         )->id);
    local_80.parent = (Type *)pRVar12;
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)(lVar17 + 0x38),
               (Expression **)&local_80);
    std::_Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>::
    ~_Vector_base((_Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_> *)
                  auStack_48);
  }
  this->numAddedFunctions = this->numAddedFunctions + 1;
  FunctionCreationContext::~FunctionCreationContext((FunctionCreationContext *)local_138);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
            ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_a8);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
            ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_60);
  return (Function *)
         local_60._M_t.
         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
}

Assistant:

Function* TranslateToFuzzReader::addFunction() {
  LOGGING_PERCENT = upToSquared(100);
  auto allocation = std::make_unique<Function>();
  auto* func = allocation.get();
  func->name = Names::getValidFunctionName(wasm, "func");
  Index numParams = upToSquared(fuzzParams->MAX_PARAMS);
  std::vector<Type> params;
  params.reserve(numParams);
  for (Index i = 0; i < numParams; i++) {
    auto type = getSingleConcreteType();
    params.push_back(type);
  }
  auto paramType = Type(params);
  auto resultType = getControlFlowType();
  func->type = Signature(paramType, resultType);
  Index numVars = upToSquared(fuzzParams->MAX_VARS);
  for (Index i = 0; i < numVars; i++) {
    auto type = getConcreteType();
    if (!TypeUpdating::canHandleAsLocal(type)) {
      type = Type::i32;
    }
    func->vars.push_back(type);
  }
  // Generate the function creation context after we filled in locals, which it
  // will scan.
  FunctionCreationContext context(*this, func);
  // with small chance, make the body unreachable
  auto bodyType = func->getResults();
  if (oneIn(10)) {
    bodyType = Type::unreachable;
  }
  // with reasonable chance make the body a block
  if (oneIn(2)) {
    func->body = makeBlock(bodyType);
  } else {
    func->body = make(bodyType);
  }

  // Add hang limit checks after all other operations on the function body.
  wasm.addFunction(std::move(allocation));
  // Export some functions, but not all (to allow inlining etc.). Try to export
  // at least one, though, to keep each testcase interesting. Avoid non-
  // nullable params, as those cannot be constructed by the fuzzer on the
  // outside.
  bool validExportParams =
    std::all_of(paramType.begin(), paramType.end(), [&](Type t) {
      return t.isDefaultable();
    });
  if (validExportParams && (numAddedFunctions == 0 || oneIn(2)) &&
      !wasm.getExportOrNull(func->name) && !preserveImportsAndExports) {
    wasm.addExport(new Export(func->name, ExternalKind::Function, func->name));
  }
  // add some to an elem segment
  while (oneIn(3) && !random.finished()) {
    auto type = Type(func->type, NonNullable);
    std::vector<ElementSegment*> compatibleSegments;
    ModuleUtils::iterActiveElementSegments(wasm, [&](ElementSegment* segment) {
      if (Type::isSubType(type, segment->type)) {
        compatibleSegments.push_back(segment);
      }
    });
    auto& randomElem = compatibleSegments[upTo(compatibleSegments.size())];
    randomElem->data.push_back(builder.makeRefFunc(func->name, func->type));
  }
  numAddedFunctions++;
  return func;
}